

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEmbeddedFileDocumentHelper.cc
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
* __thiscall
QPDFEmbeddedFileDocumentHelper::getEmbeddedFiles_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
           *__return_storage_ptr__,QPDFEmbeddedFileDocumentHelper *this)

{
  _Rb_tree_header *p_Var1;
  QPDFNameTreeObjectHelper *this_00;
  bool bVar2;
  reference __k;
  __shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2> *this_01;
  iterator __end2;
  iterator __begin2;
  __shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2> local_d0;
  iterator local_c0;
  iterator local_78;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = (((this->m).
              super___shared_ptr<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->embedded_files).
            super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (QPDFNameTreeObjectHelper *)0x0) {
    QPDFNameTreeObjectHelper::begin(&local_78,this_00);
    QPDFNameTreeObjectHelper::end(&local_c0,this_00);
    while( true ) {
      bVar2 = QPDFNameTreeObjectHelper::iterator::operator!=(&local_78,&local_c0);
      if (!bVar2) break;
      __k = QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_(&local_78);
      std::make_shared<QPDFFileSpecObjectHelper,QPDFObjectHandle_const&>
                ((QPDFObjectHandle *)&local_d0);
      this_01 = &std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
                 ::operator[](__return_storage_ptr__,&__k->first)->
                 super___shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<QPDFFileSpecObjectHelper,_(__gnu_cxx::_Lock_policy)2>::operator=
                (this_01,&local_d0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
      QPDFNameTreeObjectHelper::iterator::operator++(&local_78);
    }
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_c0);
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::shared_ptr<QPDFFileSpecObjectHelper>>
QPDFEmbeddedFileDocumentHelper::getEmbeddedFiles()
{
    std::map<std::string, std::shared_ptr<QPDFFileSpecObjectHelper>> result;
    if (m->embedded_files) {
        for (auto const& i: *(m->embedded_files)) {
            result[i.first] = std::make_shared<QPDFFileSpecObjectHelper>(i.second);
        }
    }
    return result;
}